

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

visuals_parse_context * visuals_parse_context_new(void)

{
  visuals_color_cycle **ppvVar1;
  char **ppcVar2;
  visuals_parse_context *context;
  
  context = (visuals_parse_context *)mem_zalloc(0x50);
  if (context == (visuals_parse_context *)0x0) {
    context = (visuals_parse_context *)0x0;
  }
  else {
    context->max_cycles = 0x201;
    ppvVar1 = (visuals_color_cycle **)mem_zalloc(context->max_cycles << 3);
    context->cycles = ppvVar1;
    if (context->cycles == (visuals_color_cycle **)0x0) {
      mem_free(context);
      context = (visuals_parse_context *)0x0;
    }
    else {
      context->max_groups = 8;
      ppcVar2 = (char **)mem_zalloc(context->max_groups << 3);
      context->group_names = ppcVar2;
      if (context->group_names == (char **)0x0) {
        mem_free(context->cycles);
        mem_free(context);
        context = (visuals_parse_context *)0x0;
      }
      else {
        context->max_group_cycles = context->max_groups << 6;
        ppvVar1 = (visuals_color_cycle **)mem_zalloc(context->max_group_cycles << 3);
        context->group_cycles = ppvVar1;
        if (context->group_cycles == (visuals_color_cycle **)0x0) {
          mem_free(context->group_names);
          mem_free(context->cycles);
          mem_free(context);
          context = (visuals_parse_context *)0x0;
        }
        else {
          context->cycles_index = 0;
          context->cycle_step_index = 0;
          context->flicker_color_index = 0;
          context->flicker_cycle_index = 0;
        }
      }
    }
  }
  return context;
}

Assistant:

static struct visuals_parse_context *visuals_parse_context_new(void)
{
	struct visuals_parse_context *context = mem_zalloc(sizeof(*context));

	if (context == NULL) {
		return NULL;
	}

	/* Add some extra capacity, since this array will start at 1 instead of 0. */
	context->max_cycles = VISUALS_GROUPS_MAX * VISUALS_CYCLES_MAX + 1;
	context->cycles = mem_zalloc(context->max_cycles * sizeof(*(context->cycles)));

	if (context->cycles == NULL) {
		mem_free(context);
		return NULL;
	}

	context->max_groups = VISUALS_GROUPS_MAX;
	context->group_names = mem_zalloc(context->max_groups * sizeof(*(context->group_names)));

	if (context->group_names == NULL) {
		mem_free(context->cycles);
		mem_free(context);
		return NULL;
	}

	context->max_group_cycles = context->max_groups * VISUALS_CYCLES_MAX;
	context->group_cycles = mem_zalloc(context->max_group_cycles * sizeof(*(context->group_cycles)));

	if (context->group_cycles == NULL) {
		mem_free(context->group_names);
		mem_free(context->cycles);
		mem_free(context);
		return NULL;
	}

	context->cycles_index = 0;
	context->cycle_step_index = 0;
	context->flicker_color_index = 0;
	context->flicker_cycle_index = 0;
	return context;
}